

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void __thiscall
dg::vr::RelationsAnalyzer::inferShiftInLoop
          (RelationsAnalyzer *this,
          vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
          Handle placeholder)

{
  bool bVar1;
  Shift s;
  HandlePtr pBVar2;
  VectorSet<const_llvm::Value_*> *pVVar3;
  Type TVar4;
  RelationsAnalyzer *toRels;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar5;
  
  toRels = (RelationsAnalyzer *)
           &(*(changeLocations->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_start)->relations;
  pBVar2 = getCorrespondingByContent((ValueRelations *)toRels,froms);
  pVVar3 = ValueRelations::getEqual
                     ((ValueRelations *)toRels,
                      ((pBVar2->relatedBuckets)._M_elems[10].vec.
                       super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_data);
  if ((pVVar3->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pVVar3->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    s = getShift(toRels,changeLocations,froms);
    if (s != UNKNOWN) {
      if (s < EQ) {
        inferFromNonEquality
                  (this,*(VRLocation **)
                         (**(long **)&((*(changeLocations->
                                         super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->successors).
                                      super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8),froms,s,placeholder);
      }
      TVar4 = (uint)(s != INC) * 4 + SLE;
      if (s == EQ) {
        TVar4 = EQ;
      }
      TVar4 = dg::vr::Relations::inverted(TVar4);
      pVar5 = ValueRelations::get(newGraph,*(pVVar3->vec).
                                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
      bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                        (&newGraph->graph,placeholder,TVar4,pVar5.first._M_data._M_data,
                         (Relations *)0x0);
      newGraph->changed = (bool)(newGraph->changed | bVar1);
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::inferShiftInLoop(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    const ValueRelations &predGraph = changeLocations[0]->relations;
    HandlePtr from = getCorrespondingByContent(predGraph, froms);
    assert(from);

    const auto &initial = predGraph.getEqual(predGraph.getPointedTo(*from));
    if (initial.empty())
        return;

    auto shift = getShift(changeLocations, froms);
    if (shift == Shift::UNKNOWN)
        return;

    if (shift == Shift::INC || shift == Shift::DEC)
        inferFromNonEquality(*changeLocations[0]->getSuccLocation(0), froms,
                             shift, placeholder);

    Relations::Type rel =
            shift == Shift::EQ
                    ? Relations::EQ
                    : (shift == Shift::INC ? Relations::SLE : Relations::SGE);

    // placeholder must be first so that if setting EQ, its bucket is
    // preserved
    newGraph.set(placeholder, Relations::inverted(rel), *initial.begin());
}